

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

void __thiscall
SkylineBinPack::AddWasteMapArea
          (SkylineBinPack *this,int skylineNodeIndex,int width,int height,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SkylineNode *pSVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Rect waste;
  Rect local_50;
  TArray<Rect,_Rect> *local_40;
  DisjointRectCollection *local_38;
  
  lVar7 = (long)skylineNodeIndex;
  iVar1 = (this->skyLine).Array[lVar7].x;
  iVar8 = width + iVar1;
  local_38 = &this->disjointRects;
  local_40 = &(this->wasteMap).freeRectangles;
  lVar9 = lVar7 * 0xc + 8;
  while( true ) {
    if ((int)(this->skyLine).Count <= lVar7) {
      return;
    }
    pSVar4 = (this->skyLine).Array;
    iVar2 = *(int *)((long)pSVar4 + lVar9 + -8);
    if (iVar8 <= iVar2) {
      return;
    }
    iVar6 = *(int *)((long)&pSVar4->x + lVar9) + iVar2;
    if (iVar6 <= iVar1) {
      return;
    }
    iVar3 = *(int *)((long)pSVar4 + lVar9 + -4);
    if (y < iVar3) break;
    if (iVar8 < iVar6) {
      iVar6 = iVar8;
    }
    local_50.width = iVar6 - iVar2;
    local_50.x = iVar2;
    local_50.y = iVar3;
    local_50.height = y - iVar3;
    bVar5 = DisjointRectCollection::Disjoint(local_38,&local_50);
    if (!bVar5) {
      __assert_fail("disjointRects.Disjoint(waste)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                    ,0xc6,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
    }
    TArray<Rect,_Rect>::Push(local_40,&local_50);
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + 0xc;
  }
  __assert_fail("y >= skyLine[skylineNodeIndex].y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                ,0xbd,"void SkylineBinPack::AddWasteMapArea(int, int, int, int)");
}

Assistant:

void SkylineBinPack::AddWasteMapArea(int skylineNodeIndex, int width, int height, int y)
{
	int wastedArea = 0;
	const int rectLeft = skyLine[skylineNodeIndex].x;
	const int rectRight = rectLeft + width;
	for(; skylineNodeIndex < (int)skyLine.Size() && skyLine[skylineNodeIndex].x < rectRight; ++skylineNodeIndex)
	{
		if (skyLine[skylineNodeIndex].x >= rectRight || skyLine[skylineNodeIndex].x + skyLine[skylineNodeIndex].width <= rectLeft)
			break;

		int leftSide = skyLine[skylineNodeIndex].x;
		int rightSide = MIN(rectRight, leftSide + skyLine[skylineNodeIndex].width);
		assert(y >= skyLine[skylineNodeIndex].y);

		Rect waste;
		waste.x = leftSide;
		waste.y = skyLine[skylineNodeIndex].y;
		waste.width = rightSide - leftSide;
		waste.height = y - skyLine[skylineNodeIndex].y;

#ifdef _DEBUG
		assert(disjointRects.Disjoint(waste));
#endif
		wasteMap.GetFreeRectangles().Push(waste);
	}
}